

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TestSpecParser * __thiscall Catch::TestSpecParser::parse(TestSpecParser *this,string *arg)

{
  ulong uVar1;
  long *local_38 [2];
  long local_28 [2];
  
  this->m_mode = None;
  this->m_exclusion = false;
  this->m_start = 0xffffffffffffffff;
  (*this->m_tagAliases->_vptr_ITagAliasRegistry[3])((string *)local_38,this->m_tagAliases,arg);
  std::__cxx11::string::operator=((string *)&this->m_arg,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  this->m_pos = 0;
  if ((this->m_arg)._M_string_length != 0) {
    uVar1 = 0;
    do {
      visitChar(this,(this->m_arg)._M_dataplus._M_p[uVar1]);
      uVar1 = this->m_pos + 1;
      this->m_pos = uVar1;
    } while (uVar1 < (this->m_arg)._M_string_length);
  }
  if (this->m_mode == Name) {
    addPattern<Catch::TestSpec::NamePattern>(this);
  }
  return this;
}

Assistant:

TestSpecParser& parse( std::string const& arg ) {
            m_mode = None;
            m_exclusion = false;
            m_start = std::string::npos;
            m_arg = m_tagAliases->expandAliases( arg );
            for( m_pos = 0; m_pos < m_arg.size(); ++m_pos )
                visitChar( m_arg[m_pos] );
            if( m_mode == Name )
                addPattern<TestSpec::NamePattern>();
            return *this;
        }